

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WScriptJsrt.cpp
# Opt level: O2

JsErrorCode
WScriptJsrt::FetchImportedModuleHelper
          (JsModuleRecord referencingModule,JsValueRef specifier,
          JsModuleRecord *dependentModuleRecord,LPCSTR refdir)

{
  undefined8 uVar1;
  JsErrorCode JVar2;
  char *pcVar3;
  iterator iVar4;
  mapped_type *fullDirNarrow;
  mapped_type *ppvVar5;
  mapped_type *pmVar6;
  ModuleMessage *message;
  char local_1a8 [8];
  char fullPath [260];
  char *local_98;
  string specifierFullPath;
  AutoString specifierStr;
  string pathKey;
  JsModuleRecord moduleRecord;
  
  pathKey.field_2._8_8_ = 0;
  specifierStr.data._0_5_ = 0;
  specifierStr._13_8_ = 0;
  specifierFullPath.field_2._8_8_ = 0;
  specifierStr.length._0_5_ = 0;
  specifierStr.length._5_3_ = 0;
  *dependentModuleRecord = (JsModuleRecord)0x0;
  JVar2 = AutoString::Initialize((AutoString *)((long)&specifierFullPath.field_2 + 8),specifier);
  if (JVar2 != JsNoError) {
    JVar2 = (JsErrorCode)specifierStr.data_wide;
    goto LAB_001122bd;
  }
  pcVar3 = "";
  if (refdir != (LPCSTR)0x0) {
    pcVar3 = refdir;
  }
  std::__cxx11::string::string((string *)&local_98,pcVar3,(allocator *)&specifierStr.errorCode);
  std::__cxx11::string::append((char *)&local_98);
  pcVar3 = _fullpath(local_1a8,local_98,0x104);
  if (pcVar3 == (char *)0x0) {
    JVar2 = JsErrorInvalidArgument;
  }
  else {
    std::__cxx11::string::string
              ((string *)&specifierStr.errorCode,local_1a8,(allocator *)((long)&moduleRecord + 7));
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
            ::find(&moduleRecordMap_abi_cxx11_._M_t,(key_type *)&specifierStr.errorCode);
    std::__cxx11::string::~string((string *)&specifierStr.errorCode);
    if ((_Rb_tree_header *)iVar4._M_node ==
        &moduleRecordMap_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
      JVar2 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtInitializeModuleRecord)
                        (referencingModule,specifier,(JsModuleRecord *)((long)&pathKey.field_2 + 8))
      ;
      if (JVar2 == JsNoError) {
        fullDirNarrow =
             std::
             map<void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&moduleDirMap_abi_cxx11_,(key_type *)((long)&pathKey.field_2 + 8));
        GetDir(local_1a8,fullDirNarrow);
        std::__cxx11::string::string
                  ((string *)&specifierStr.errorCode,local_1a8,
                   (allocator *)((long)&moduleRecord + 7));
        uVar1 = pathKey.field_2._8_8_;
        ppvVar5 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
                  ::operator[](&moduleRecordMap_abi_cxx11_,(key_type *)&specifierStr.errorCode);
        *ppvVar5 = (mapped_type)uVar1;
        pmVar6 = std::
                 map<void_*,_ModuleState,_std::less<void_*>,_std::allocator<std::pair<void_*const,_ModuleState>_>_>
                 ::operator[](&moduleErrMap,(key_type *)((long)&pathKey.field_2 + 8));
        *pmVar6 = ImportedModule;
        message = ModuleMessage::Create
                            (referencingModule,specifier,(string *)&specifierStr.errorCode);
        if (message != (ModuleMessage *)0x0) {
          PushMessage(&message->super_MessageBase);
          *dependentModuleRecord = (JsModuleRecord)pathKey.field_2._8_8_;
          std::__cxx11::string::~string((string *)&specifierStr.errorCode);
          goto LAB_00112286;
        }
        std::__cxx11::string::~string((string *)&specifierStr.errorCode);
        JVar2 = JsErrorOutOfMemory;
      }
    }
    else {
      *dependentModuleRecord = *(JsModuleRecord *)(iVar4._M_node + 2);
LAB_00112286:
      JVar2 = JsNoError;
    }
  }
  std::__cxx11::string::~string((string *)&local_98);
LAB_001122bd:
  AutoString::~AutoString((AutoString *)((long)&specifierFullPath.field_2 + 8));
  return JVar2;
}

Assistant:

JsErrorCode WScriptJsrt::FetchImportedModuleHelper(JsModuleRecord referencingModule,
    JsValueRef specifier, __out JsModuleRecord* dependentModuleRecord, LPCSTR refdir)
{
    JsModuleRecord moduleRecord = JS_INVALID_REFERENCE;
    AutoString specifierStr;
    *dependentModuleRecord = nullptr;

    if (specifierStr.Initialize(specifier) != JsNoError)
    {
        return specifierStr.GetError();
    }

    char fullPath[_MAX_PATH];
    std::string specifierFullPath = refdir ? refdir : "";
    specifierFullPath += *specifierStr;
    if (_fullpath(fullPath, specifierFullPath.c_str(), _MAX_PATH) == nullptr)
    {
        return JsErrorInvalidArgument;
    }

    auto moduleEntry = moduleRecordMap.find(std::string(fullPath));
    if (moduleEntry != moduleRecordMap.end())
    {
        *dependentModuleRecord = moduleEntry->second;
        return JsNoError;
    }

    JsErrorCode errorCode = ChakraRTInterface::JsInitializeModuleRecord(referencingModule, specifier, &moduleRecord);
    if (errorCode == JsNoError)
    {
        GetDir(fullPath, &moduleDirMap[moduleRecord]);
        std::string pathKey = std::string(fullPath);
        moduleRecordMap[pathKey] = moduleRecord;
        moduleErrMap[moduleRecord] = ImportedModule;
        ModuleMessage* moduleMessage = WScriptJsrt::ModuleMessage::Create(referencingModule, specifier, &pathKey);
        if (moduleMessage == nullptr)
        {
            return JsErrorOutOfMemory;
        }
        WScriptJsrt::PushMessage(moduleMessage);
        *dependentModuleRecord = moduleRecord;
    }
    return errorCode;
}